

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-item-wear.c
# Opt level: O1

_Bool borg_swap_rings(void)

{
  ushort uVar1;
  wchar_t wVar2;
  int32_t iVar3;
  int32_t local_34;
  
  wVar2 = borg_first_empty_inventory_slot();
  if ((((wVar2 != L'\xffffffff') &&
       (uVar1 = z_info->pack_size, wVar2 + L'\x01' < (int)((uint)uVar1 - borg.trait[0x9e]))) &&
      (borg_t - borg_began < 0x3e9)) && (borg.trait[0x69] == 0)) {
    if (((borg_items[(ulong)uVar1 + 3].iqty != '\0') && (borg_items[(ulong)uVar1 + 2].iqty == '\0'))
       && (borg_items[(ulong)uVar1 + 3].one_ring == false)) {
      borg_note("# Taking off naked loose ring.");
      borg_keypress(0x74);
      borg_keypress(100);
      return true;
    }
    if ((borg_items[(ulong)uVar1 + 2].iqty != '\0') &&
       (borg_items[(ulong)uVar1 + 2].one_ring == false)) {
      if (borg_items[(ulong)uVar1 + 3].iqty == '\0') {
        memcpy(borg_items + wVar2,borg_items + (ulong)uVar1 + 3,0x388);
        borg_items[(ulong)z_info->pack_size + 3].iqty = '\0';
        borg_notice(true);
        local_34 = borg_power();
        memcpy(borg_items + (ulong)z_info->pack_size + 3,safe_items + (ulong)z_info->pack_size + 3,
               0x388);
        borg_items[wVar2].iqty = '\0';
      }
      else {
        local_34 = borg.power;
      }
      memcpy(borg_items + wVar2,borg_items + (ulong)z_info->pack_size + 2,0x388);
      borg_items[(ulong)z_info->pack_size + 2].iqty = '\0';
      borg_notice(false);
      iVar3 = borg_power();
      memcpy(borg_items + (ulong)z_info->pack_size + 2,safe_items + (ulong)z_info->pack_size + 2,
             0x388);
      borg_items[wVar2].iqty = '\0';
      if (local_34 < iVar3) {
        borg_note("# Taking off less valuable right ring.");
        if (borg_items[(ulong)z_info->pack_size + 2].iqty != '\0') {
          borg_keypress(0x74);
          borg_keypress(99);
        }
        if (borg_items[(ulong)z_info->pack_size + 3].iqty == '\0') {
          return true;
        }
        borg_note("# Taking off more valuable left ring.");
        borg_keypress(0x74);
        borg_keypress(100);
        return true;
      }
      borg_notice(true);
    }
  }
  return false;
}

Assistant:

bool borg_swap_rings(void)
{
    int hole = borg_first_empty_inventory_slot();

    int32_t v1, v2;

    /*** Check conditions ***/

    /* Require two empty slots */
    if (hole == -1)
        return false;

    if ((hole + 1) >= PACK_SLOTS)
        return false;

    /* Forbid if been sitting on level forever */
    /*    Just come back and work through the loop later */
    if (borg_t - borg_began > 1000)
        return false;
    if (borg.trait[BI_CDEPTH] != 0)
        return false;

    /*** Remove naked "loose" rings ***/

    /* Remove any naked loose ring */
    if (borg_items[INVEN_LEFT].iqty && !borg_items[INVEN_RIGHT].iqty
        && !borg_items[INVEN_LEFT].one_ring) {
        /* Log */
        borg_note("# Taking off naked loose ring.");

        /* Remove it */
        borg_keypress('t');
        borg_keypress(all_letters_nohjkl[INVEN_LEFT - INVEN_WIELD]);

        /* Success */
        return true;
    }

    /*** Check conditions ***/

    /* Require "tight" ring */
    if (!borg_items[INVEN_RIGHT].iqty)
        return false;

    /* Cannot remove the One Ring */
    if (borg_items[INVEN_RIGHT].one_ring)
        return false;

    /*** Remove nasty "tight" rings ***/

    if (!borg_items[INVEN_LEFT].iqty) {
        /* Take off the ring */
        memcpy(&borg_items[hole], &borg_items[INVEN_LEFT], sizeof(borg_item));

        /* Erase left ring */
        borg_items[INVEN_LEFT].iqty = 0;

        /* Examine the inventory */
        borg_notice(true);

        /* Evaluate the inventory */
        v1 = borg_power();

        /* Restore the ring */
        memcpy(&borg_items[INVEN_LEFT], &safe_items[INVEN_LEFT], sizeof(borg_item));

        /* Restore the hole */
        borg_items[hole].iqty = 0;
    } else
        v1 = borg.power;

    /*** Consider taking off the "right" ring ***/

    /* Take off the ring */
    memcpy(&borg_items[hole], &borg_items[INVEN_RIGHT], sizeof(borg_item));

    /* Erase the ring */
    borg_items[INVEN_RIGHT].iqty = 0;

    /* Examine the inventory */
    borg_notice(false);

    /* Evaluate the inventory */
    v2 = borg_power();

    /* Restore the ring */
    memcpy(&borg_items[INVEN_RIGHT], &safe_items[INVEN_RIGHT], sizeof(borg_item));

    /* Restore the hole */
    borg_items[hole].iqty = 0;

    /*** Swap rings if necessary ***/

    /* Remove "useless" ring */
    if (v2 > v1) {
        /* Log */
        borg_note("# Taking off less valuable right ring.");

        /* Take it off */
        if (borg_items[INVEN_RIGHT].iqty) {
            borg_keypress('t');
            borg_keypress(all_letters_nohjkl[INVEN_RIGHT - INVEN_WIELD]);
        }

        /* make sure one is on the left */
        if (borg_items[INVEN_LEFT].iqty) {
            borg_note("# Taking off more valuable left ring.");
            borg_keypress('t');
            borg_keypress(all_letters_nohjkl[INVEN_LEFT - INVEN_WIELD]);
        }

        /* Success */
        return true;
    }

    /* fix the inventory */
    borg_notice(true);

    /* Nope */
    return false;
}